

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkScrew.cpp
# Opt level: O2

void __thiscall chrono::ChLinkScrew::ArchiveOUT(ChLinkScrew *this,ChArchiveOut *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveOut::VersionWrite<chrono::ChLinkScrew>(marchive);
  ChLinkLock::ArchiveOUT(&this->super_ChLinkLock,marchive);
  local_28._value = &this->tau;
  local_28._name = "tau";
  local_28._flags = '\0';
  ChArchiveOut::operator<<(marchive,&local_28);
  return;
}

Assistant:

void ChLinkScrew::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChLinkScrew>();

    // serialize parent class
    ChLinkLock::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(tau);
}